

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O0

int ARKBBDPrecInit(void *arkode_mem,sunindextype Nlocal,sunindextype mudq,sunindextype mldq,
                  sunindextype mukeep,sunindextype mlkeep,sunrealtype dqrely,ARKLocalFn gloc,
                  ARKCommFn cfn)

{
  int iVar1;
  long ml;
  SUNMatrix p_Var2;
  SUNContext_conflict sunctx;
  N_Vector p_Var3;
  SUNLinearSolver p_Var4;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  sunindextype in_R8;
  SUNContext_conflict in_R9;
  double in_XMM0_Qa;
  long in_stack_00000008;
  long in_stack_00000010;
  int retval;
  long liw;
  long lrw;
  sunindextype liw1;
  sunindextype lrw1;
  sunindextype storage_mu;
  sunindextype mlk;
  sunindextype muk;
  ARKBBDPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  N_Vector *in_stack_fffffffffffffec8;
  ARKodeMem in_stack_fffffffffffffed0;
  ARKodeMem in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  SUNContext_conflict in_stack_fffffffffffffee8;
  SUNContext_conflict sunctx_00;
  SUNContext_conflict arkode_mem_00;
  sunindextype in_stack_ffffffffffffff08;
  long N;
  long local_e8;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  long local_78;
  SUNContext_conflict local_70;
  SUNContext_conflict local_68;
  long local_60;
  long *local_58;
  long in_stack_ffffffffffffffb0;
  ARKodeMem in_stack_ffffffffffffffb8;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                       (ARKodeMem *)in_stack_fffffffffffffed8,(ARKLsMem *)in_stack_fffffffffffffed0)
  ;
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffb8->tempv1->ops->nvgetarraypointer ==
        (_func_sunrealtype_ptr_N_Vector *)0x0) {
      arkProcessError(in_stack_ffffffffffffffb8,-3,0x46,"ARKBBDPrecInit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      local_58 = (long *)0x0;
      local_58 = (long *)malloc(0xa0);
      if (local_58 == (long *)0x0) {
        arkProcessError(in_stack_ffffffffffffffb8,-4,0x50,"ARKBBDPrecInit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                        ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        local_58[0x13] = in_RDI;
        local_58[5] = in_stack_00000008;
        local_58[6] = in_stack_00000010;
        local_a8 = in_RDX;
        if (in_RDX < 0) {
          local_a8 = 0;
        }
        if (in_RSI + -1 < local_a8) {
          local_b0 = in_RSI + -1;
        }
        else {
          local_b8 = in_RDX;
          if (in_RDX < 0) {
            local_b8 = 0;
          }
          local_b0 = local_b8;
        }
        *local_58 = local_b0;
        local_c8 = in_RCX;
        if (in_RCX < 0) {
          local_c8 = 0;
        }
        if (in_RSI + -1 < local_c8) {
          local_d0 = in_RSI + -1;
        }
        else {
          local_d8 = in_RCX;
          if (in_RCX < 0) {
            local_d8 = 0;
          }
          local_d0 = local_d8;
        }
        local_58[1] = local_d0;
        local_e8 = in_R8;
        if (in_R8 < 0) {
          local_e8 = 0;
        }
        if (in_RSI + -1 < local_e8) {
          in_R8 = in_stack_ffffffffffffff08;
          N = in_RSI + -1;
        }
        else {
          N = in_R8;
          if (in_R8 < 0) {
            in_R8 = 0;
            N = in_R8;
          }
        }
        ml = in_RSI + -1;
        arkode_mem_00 = in_R9;
        if ((long)in_R9 < 0) {
          arkode_mem_00 = (SUNContext_conflict)0x0;
        }
        if (ml < (long)arkode_mem_00) {
          in_R9 = in_stack_fffffffffffffee8;
          sunctx_00 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          sunctx_00 = in_R9;
          if ((long)in_R9 < 0) {
            in_R9 = (SUNContext_conflict)0x0;
            sunctx_00 = in_R9;
          }
        }
        local_58[2] = N;
        local_58[3] = (long)sunctx_00;
        local_68 = sunctx_00;
        local_60 = N;
        p_Var2 = SUNBandMatrixStorage(N,in_R8,ml,(sunindextype)arkode_mem_00,sunctx_00);
        local_58[7] = (long)p_Var2;
        if (local_58[7] == 0) {
          free(local_58);
          local_58 = (long *)0x0;
          arkProcessError(in_stack_ffffffffffffffb8,-4,0x66,"ARKBBDPrecInit",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                          ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          if (in_RSI + -1 < (long)&local_68->profiler + local_60) {
            sunctx = (SUNContext_conflict)(in_RSI + -1);
          }
          else {
            sunctx = (SUNContext_conflict)((long)&local_68->profiler + local_60);
          }
          local_58[8] = 0;
          local_70 = sunctx;
          p_Var2 = SUNBandMatrixStorage(N,in_R8,ml,(sunindextype)arkode_mem_00,sunctx_00);
          local_58[8] = (long)p_Var2;
          if (local_58[8] == 0) {
            SUNMatDestroy(local_58[7]);
            free(local_58);
            local_58 = (long *)0x0;
            arkProcessError(in_stack_ffffffffffffffb8,-4,0x75,"ARKBBDPrecInit",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                            ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            local_58[0xd] = 0;
            p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,
                                        (SUNContext_conflict)in_stack_fffffffffffffed8);
            local_58[0xd] = (long)p_Var3;
            if (local_58[0xd] == 0) {
              SUNMatDestroy(local_58[8]);
              SUNMatDestroy(local_58[7]);
              free(local_58);
              local_58 = (long *)0x0;
              arkProcessError(in_stack_ffffffffffffffb8,-4,0x84,"ARKBBDPrecInit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                              ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              local_58[0xe] = 0;
              p_Var3 = N_VNewEmpty_Serial((sunindextype)sunctx,
                                          (SUNContext_conflict)in_stack_fffffffffffffed8);
              local_58[0xe] = (long)p_Var3;
              if (local_58[0xe] == 0) {
                N_VDestroy(local_58[0xd]);
                SUNMatDestroy(local_58[8]);
                SUNMatDestroy(local_58[7]);
                free(local_58);
                local_58 = (long *)0x0;
                arkProcessError(in_stack_ffffffffffffffb8,-4,0x92,"ARKBBDPrecInit",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                local_58[10] = 0;
                iVar1 = arkAllocVec(in_stack_fffffffffffffed8,(N_Vector)in_stack_fffffffffffffed0,
                                    in_stack_fffffffffffffec8);
                if (iVar1 == 0) {
                  N_VDestroy(local_58[0xd]);
                  N_VDestroy(local_58[0xe]);
                  SUNMatDestroy(local_58[8]);
                  SUNMatDestroy(local_58[7]);
                  free(local_58);
                  local_58 = (long *)0x0;
                  arkProcessError(in_stack_ffffffffffffffb8,-4,0xa0,"ARKBBDPrecInit",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                  ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  local_58[0xb] = 0;
                  iVar1 = arkAllocVec(in_stack_fffffffffffffed8,(N_Vector)in_stack_fffffffffffffed0,
                                      in_stack_fffffffffffffec8);
                  if (iVar1 == 0) {
                    arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                    N_VDestroy(local_58[0xd]);
                    N_VDestroy(local_58[0xe]);
                    SUNMatDestroy(local_58[8]);
                    SUNMatDestroy(local_58[7]);
                    free(local_58);
                    local_58 = (long *)0x0;
                    arkProcessError(in_stack_ffffffffffffffb8,-4,0xaf,"ARKBBDPrecInit",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                    ,"A memory request failed.");
                    local_4 = -4;
                  }
                  else {
                    local_58[0xc] = 0;
                    iVar1 = arkAllocVec(in_stack_fffffffffffffed8,
                                        (N_Vector)in_stack_fffffffffffffed0,
                                        in_stack_fffffffffffffec8);
                    if (iVar1 == 0) {
                      arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                      arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                      N_VDestroy(local_58[0xd]);
                      N_VDestroy(local_58[0xe]);
                      SUNMatDestroy(local_58[8]);
                      SUNMatDestroy(local_58[7]);
                      free(local_58);
                      local_58 = (long *)0x0;
                      arkProcessError(in_stack_ffffffffffffffb8,-4,0xbf,"ARKBBDPrecInit",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                      ,"A memory request failed.");
                      local_4 = -4;
                    }
                    else {
                      local_58[9] = 0;
                      p_Var4 = SUNLinSol_Band((N_Vector)sunctx_00,(SUNMatrix)in_R9,sunctx);
                      local_58[9] = (long)p_Var4;
                      if (local_58[9] == 0) {
                        arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                        arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                        arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                        N_VDestroy(local_58[0xd]);
                        N_VDestroy(local_58[0xe]);
                        SUNMatDestroy(local_58[8]);
                        SUNMatDestroy(local_58[7]);
                        free(local_58);
                        local_58 = (long *)0x0;
                        arkProcessError(in_stack_ffffffffffffffb8,-4,0xd2,"ARKBBDPrecInit",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                        ,"A memory request failed.");
                        local_4 = -4;
                      }
                      else {
                        SUNLinSolInitialize(local_58[9]);
                        if (local_58[9] == 0) {
                          arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                          arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                          arkFreeVec(in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
                          N_VDestroy(local_58[0xd]);
                          N_VDestroy(local_58[0xe]);
                          SUNMatDestroy(local_58[8]);
                          SUNMatDestroy(local_58[7]);
                          SUNLinSolFree(local_58[9]);
                          free(local_58);
                          local_58 = (long *)0x0;
                          arkProcessError(in_stack_ffffffffffffffb8,-0xc,0xe5,"ARKBBDPrecInit",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                                          ,"An error arose from a SUNBandLinearSolver routine.");
                          local_4 = -0xc;
                        }
                        else {
                          if (in_XMM0_Qa <= 0.0) {
                            if (0.0 < in_stack_ffffffffffffffb8->uround) {
                              in_XMM0_Qa = sqrt(in_stack_ffffffffffffffb8->uround);
                            }
                            else {
                              in_XMM0_Qa = 0.0;
                            }
                          }
                          local_58[4] = (long)in_XMM0_Qa;
                          local_58[0xf] = in_RSI;
                          local_58[0x10] = 0;
                          local_58[0x11] = 0;
                          if (in_stack_ffffffffffffffb8->tempv1->ops->nvspace !=
                              (_func_void_N_Vector_sunindextype_ptr_sunindextype_ptr *)0x0) {
                            N_VSpace(in_stack_ffffffffffffffb8->tempv1,&local_78,&local_80);
                            local_58[0x10] = local_78 * 3 + local_58[0x10];
                            local_58[0x11] = local_80 * 3 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[0xe] + 8) + 0x20) != 0) {
                            N_VSpace(local_58[0xe],&local_78,&local_80);
                            local_58[0x10] = local_78 * 2 + local_58[0x10];
                            local_58[0x11] = local_80 * 2 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[7] + 8) + 0x48) != 0) {
                            SUNMatSpace(local_58[7],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[8] + 8) + 0x48) != 0) {
                            SUNMatSpace(local_58[8],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          if (*(long *)(*(long *)(local_58[9] + 8) + 0x60) != 0) {
                            SUNLinSolSpace(local_58[9],&local_88,&local_90);
                            local_58[0x10] = local_88 + local_58[0x10];
                            local_58[0x11] = local_90 + local_58[0x11];
                          }
                          local_58[0x12] = 0;
                          if (*(long *)(in_stack_ffffffffffffffb0 + 0xe0) != 0) {
                            (**(code **)(in_stack_ffffffffffffffb0 + 0xe0))
                                      (in_stack_ffffffffffffffb8);
                          }
                          *(long **)(in_stack_ffffffffffffffb0 + 0xe8) = local_58;
                          *(code **)(in_stack_ffffffffffffffb0 + 0xe0) = ARKBBDPrecFree;
                          local_4 = ARKodeSetPreconditioner
                                              (arkode_mem_00,(ARKLsPrecSetupFn)sunctx_00,
                                               (ARKLsPrecSolveFn)in_R9);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int ARKBBDPrecInit(void* arkode_mem, sunindextype Nlocal, sunindextype mudq,
                   sunindextype mldq, sunindextype mukeep, sunindextype mlkeep,
                   sunrealtype dqrely, ARKLocalFn gloc, ARKCommFn cfn)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  sunindextype muk, mlk, storage_mu, lrw1, liw1;
  long int lrw, liw;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Test compatibility of NVECTOR package with the BBD preconditioner */
  if (ark_mem->tempv1->ops->nvgetarraypointer == NULL)
  {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BBD_BAD_NVECTOR);
    return (ARKLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (ARKBBDPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Set pointers to gloc and cfn; load half-bandwidths */
  pdata->arkode_mem = arkode_mem;
  pdata->gloc       = gloc;
  pdata->cfn        = cfn;
  pdata->mudq       = SUNMIN(Nlocal - 1, SUNMAX(0, mudq));
  pdata->mldq       = SUNMIN(Nlocal - 1, SUNMAX(0, mldq));
  muk               = SUNMIN(Nlocal - 1, SUNMAX(0, mukeep));
  mlk               = SUNMIN(Nlocal - 1, SUNMAX(0, mlkeep));
  pdata->mukeep     = muk;
  pdata->mlkeep     = mlk;

  /* Allocate memory for saved Jacobian */
  pdata->savedJ = SUNBandMatrixStorage(Nlocal, muk, mlk, muk, ark_mem->sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for preconditioner matrix */
  storage_mu    = SUNMIN(Nlocal - 1, muk + mlk);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(Nlocal, muk, mlk, storage_mu,
                                       ark_mem->sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for temporary N_Vectors */

  pdata->zlocal = NULL;
  pdata->zlocal = N_VNewEmpty_Serial(Nlocal, ark_mem->sunctx);
  if (pdata->zlocal == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->rlocal = NULL;
  pdata->rlocal = N_VNewEmpty_Serial(Nlocal, ark_mem->sunctx);
  if (pdata->rlocal == NULL)
  {
    N_VDestroy(pdata->zlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp1 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp1)))
  {
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp2 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp2)))
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  pdata->tmp3 = NULL;
  if (!arkAllocVec(ark_mem, ark_mem->tempv1, &(pdata->tmp3)))
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(pdata->rlocal, pdata->savedP, ark_mem->sunctx);
  if (pdata->LS == NULL)
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    arkFreeVec(ark_mem, &(pdata->tmp3));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_MEM_FAIL);
    return (ARKLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  retval = SUNLinSolInitialize(pdata->LS);
  if (pdata->LS == NULL)
  {
    arkFreeVec(ark_mem, &(pdata->tmp1));
    arkFreeVec(ark_mem, &(pdata->tmp2));
    arkFreeVec(ark_mem, &(pdata->tmp3));
    N_VDestroy(pdata->zlocal);
    N_VDestroy(pdata->rlocal);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    SUNLinSolFree(pdata->LS);
    free(pdata);
    pdata = NULL;
    arkProcessError(ark_mem, ARKLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                    MSG_BBD_SUNLS_FAIL);
    return (ARKLS_SUNLS_FAIL);
  }

  /* Set dqrely based on input dqrely (0 implies default). */
  pdata->dqrely = (dqrely > ZERO) ? dqrely : SUNRsqrt(ark_mem->uround);

  /* Store Nlocal to be used in ARKBBDPrecSetup */
  pdata->n_local = Nlocal;

  /* Set work space sizes and initialize nge */
  pdata->rpwsize = 0;
  pdata->ipwsize = 0;
  if (ark_mem->tempv1->ops->nvspace)
  {
    N_VSpace(ark_mem->tempv1, &lrw1, &liw1);
    pdata->rpwsize += 3 * lrw1;
    pdata->ipwsize += 3 * liw1;
  }
  if (pdata->rlocal->ops->nvspace)
  {
    N_VSpace(pdata->rlocal, &lrw1, &liw1);
    pdata->rpwsize += 2 * lrw1;
    pdata->ipwsize += 2 * liw1;
  }
  if (pdata->savedJ->ops->space)
  {
    retval = SUNMatSpace(pdata->savedJ, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->savedP->ops->space)
  {
    retval = SUNMatSpace(pdata->savedP, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  if (pdata->LS->ops->space)
  {
    retval = SUNLinSolSpace(pdata->LS, &lrw, &liw);
    pdata->rpwsize += lrw;
    pdata->ipwsize += liw;
  }
  pdata->nge = 0;

  /* make sure P_data is free from any previous allocations */
  if (arkls_mem->pfree) { arkls_mem->pfree(ark_mem); }

  /* Point to the new P_data field in the LS memory */
  arkls_mem->P_data = pdata;

  /* Attach the pfree function */
  arkls_mem->pfree = ARKBBDPrecFree;

  /* Attach preconditioner solve and setup functions */
  retval = ARKodeSetPreconditioner(arkode_mem, ARKBBDPrecSetup, ARKBBDPrecSolve);

  return (retval);
}